

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O2

float btSoftBodyHelpers::CalculateUV(int resx,int resy,int ix,int iy,int id)

{
  float fVar1;
  float fVar2;
  
  switch(id) {
  case 0:
    break;
  case 1:
    fVar2 = 1.0 / (float)(resy + -1);
    fVar1 = (float)((resy + -1) - iy);
    goto LAB_001ad017;
  case 2:
    fVar2 = 1.0 / (float)(resy + -1);
    fVar1 = (float)(resy + ~iy + -1);
    goto LAB_001ad017;
  case 3:
    ix = ix + 1;
    break;
  default:
    return 0.0;
  }
  fVar2 = 1.0 / (float)(resx + -1);
  fVar1 = (float)ix;
LAB_001ad017:
  return fVar1 * fVar2;
}

Assistant:

float   btSoftBodyHelpers::CalculateUV(int resx,int resy,int ix,int iy,int id)
{

	/*
	*
	*
	*    node00 --- node01
	*      |          |
	*    node10 --- node11
	*
	*
	*   ID map:
	*
	*   node00 s --> 0
	*   node00 t --> 1
	*
	*   node01 s --> 3
	*   node01 t --> 1
	*
	*   node10 s --> 0
	*   node10 t --> 2
	*
	*   node11 s --> 3
	*   node11 t --> 2
	*
	*
	*/

	float tc=0.0f;
	if (id == 0) {
		tc = (1.0f/((resx-1))*ix);
	}
	else if (id==1) {
		tc = (1.0f/((resy-1))*(resy-1-iy));
	}
	else if (id==2) {
		tc = (1.0f/((resy-1))*(resy-1-iy-1));
	}
	else if (id==3) {
		tc = (1.0f/((resx-1))*(ix+1));
	}
	return tc;
}